

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O0

void crypto::iterated_hash<crypto::sha256_transform>::prepare_state
               (char *data,size_t count,hash_word *state)

{
  EVP_PKEY_CTX *in_RDX;
  size_t in_stack_00000030;
  char *in_stack_00000038;
  hash_word *in_stack_00000040;
  
  sha256_transform::init(in_RDX);
  hash(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  return;
}

Assistant:

static void prepare_state(const char * data, size_t count, state_t state) {
		transform::init(state);
		hash(state, data, count * block_size);
	}